

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__getpwuid_r(uv_passwd_t *pwd)

{
  __uid_t __uid;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  int r;
  long initsize;
  size_t shell_size;
  size_t homedir_size;
  size_t name_size;
  size_t bufsize;
  char *pcStack_58;
  uid_t uid;
  char *buf;
  passwd *result;
  passwd pw;
  uv_passwd_t *pwd_local;
  
  if (pwd == (uv_passwd_t *)0x0) {
    pwd_local._4_4_ = -0x16;
  }
  else {
    pw.pw_shell = (char *)pwd;
    name_size = sysconf(0x46);
    if ((long)name_size < 1) {
      name_size = 0x1000;
    }
    __uid = geteuid();
    pcStack_58 = (char *)0x0;
    while( true ) {
      uv__free(pcStack_58);
      pcStack_58 = (char *)uv__malloc(name_size);
      if (pcStack_58 == (char *)0x0) break;
      do {
        iVar1 = getpwuid_r(__uid,(passwd *)&result,pcStack_58,name_size,(passwd **)&buf);
      } while (iVar1 == 4);
      if (iVar1 != 0x22) {
        if (iVar1 != 0) {
          uv__free(pcStack_58);
          return -iVar1;
        }
        if (buf == (char *)0x0) {
          uv__free(pcStack_58);
          return -2;
        }
        sVar2 = strlen((char *)result);
        sVar2 = sVar2 + 1;
        sVar3 = strlen(pw.pw_gecos);
        sVar3 = sVar3 + 1;
        sVar4 = strlen(pw.pw_dir);
        pvVar5 = uv__malloc(sVar2 + sVar3 + sVar4 + 1);
        *(void **)pw.pw_shell = pvVar5;
        if (*(long *)pw.pw_shell == 0) {
          uv__free(pcStack_58);
          return -0xc;
        }
        memcpy(*(void **)pw.pw_shell,result,sVar2);
        *(size_t *)(pw.pw_shell + 0x20) = *(long *)pw.pw_shell + sVar2;
        memcpy(*(void **)(pw.pw_shell + 0x20),pw.pw_gecos,sVar3);
        *(size_t *)(pw.pw_shell + 0x18) = *(long *)(pw.pw_shell + 0x20) + sVar3;
        memcpy(*(void **)(pw.pw_shell + 0x18),pw.pw_dir,sVar4 + 1);
        *(ulong *)(pw.pw_shell + 8) = (ulong)(uint)pw.pw_passwd;
        *(ulong *)(pw.pw_shell + 0x10) = (ulong)pw.pw_passwd._4_4_;
        uv__free(pcStack_58);
        return 0;
      }
      name_size = name_size << 1;
    }
    pwd_local._4_4_ = -0xc;
  }
  return pwd_local._4_4_;
}

Assistant:

int uv__getpwuid_r(uv_passwd_t* pwd) {
  struct passwd pw;
  struct passwd* result;
  char* buf;
  uid_t uid;
  size_t bufsize;
  size_t name_size;
  size_t homedir_size;
  size_t shell_size;
  long initsize;
  int r;

  if (pwd == NULL)
    return UV_EINVAL;

  initsize = sysconf(_SC_GETPW_R_SIZE_MAX);

  if (initsize <= 0)
    bufsize = 4096;
  else
    bufsize = (size_t) initsize;

  uid = geteuid();
  buf = NULL;

  for (;;) {
    uv__free(buf);
    buf = uv__malloc(bufsize);

    if (buf == NULL)
      return UV_ENOMEM;

    do
      r = getpwuid_r(uid, &pw, buf, bufsize, &result);
    while (r == EINTR);

    if (r != ERANGE)
      break;

    bufsize *= 2;
  }

  if (r != 0) {
    uv__free(buf);
    return UV__ERR(r);
  }

  if (result == NULL) {
    uv__free(buf);
    return UV_ENOENT;
  }

  /* Allocate memory for the username, shell, and home directory */
  name_size = strlen(pw.pw_name) + 1;
  homedir_size = strlen(pw.pw_dir) + 1;
  shell_size = strlen(pw.pw_shell) + 1;
  pwd->username = uv__malloc(name_size + homedir_size + shell_size);

  if (pwd->username == NULL) {
    uv__free(buf);
    return UV_ENOMEM;
  }

  /* Copy the username */
  memcpy(pwd->username, pw.pw_name, name_size);

  /* Copy the home directory */
  pwd->homedir = pwd->username + name_size;
  memcpy(pwd->homedir, pw.pw_dir, homedir_size);

  /* Copy the shell */
  pwd->shell = pwd->homedir + homedir_size;
  memcpy(pwd->shell, pw.pw_shell, shell_size);

  /* Copy the uid and gid */
  pwd->uid = pw.pw_uid;
  pwd->gid = pw.pw_gid;

  uv__free(buf);

  return 0;
}